

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

void __thiscall Assimp::LWOImporter::LoadLWO2ImageMap(LWOImporter *this,uint size,Texture *tex)

{
  uint *puVar1;
  char cVar2;
  ushort uVar3;
  uint *puVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint *puVar7;
  Logger *this_00;
  runtime_error *this_01;
  int iVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string *local_40;
  Texture *local_38;
  
  if (6 < size) {
    puVar4 = (uint *)this->mFileBuffer;
    puVar10 = (uint *)((long)puVar4 + 6);
    local_40 = (string *)&tex->mUVChannelIndex;
    puVar7 = puVar4;
    local_38 = tex;
    do {
      uVar11 = *puVar7;
      this->mFileBuffer = (uint8_t *)(puVar7 + 1);
      uVar6 = puVar7[1];
      this->mFileBuffer = (uint8_t *)puVar10;
      uVar9 = (ulong)(ushort)((ushort)uVar6 << 8 | (ushort)uVar6 >> 8);
      puVar1 = (uint *)(uVar9 + (long)puVar10);
      if ((uint *)((ulong)size + (long)puVar4) < puVar1) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_60,"LWO2: Invalid SURF.BLOCK chunk length","");
        std::runtime_error::runtime_error(this_01,(string *)local_60);
        *(undefined ***)this_01 = &PTR__runtime_error_00900168;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
      if ((int)uVar11 < 0x564d4150) {
        if (uVar11 == 0x41584953) {
          uVar11 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar7 + 2);
          tex->majorAxis = (uint)(ushort)((ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
        }
        else if (uVar11 == 0x494d4147) {
          uVar11 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar7 + 2);
          tex->mClipIdx = (uint)(ushort)((ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
        }
        else if (uVar11 == 0x50524f4a) {
          uVar11 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar7 + 2);
          tex->mapMode = (uint)(ushort)((ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
        }
      }
      else if ((int)uVar11 < 0x57525048) {
        if (uVar11 == 0x564d4150) {
          cVar2 = (char)*puVar10;
          puVar7 = puVar10;
          while (cVar2 != '\0') {
            puVar7 = (uint *)((long)puVar7 + 1);
            iVar8 = (int)uVar9;
            uVar9 = (ulong)(iVar8 - 1);
            if (iVar8 == 0) {
              this_00 = DefaultLogger::get();
              Logger::warn(this_00,"LWO: Invalid file, string is is too long");
              break;
            }
            this->mFileBuffer = (uint8_t *)puVar7;
            cVar2 = *(char *)puVar7;
          }
          puVar5 = this->mFileBuffer;
          local_60[0] = local_50;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_60,puVar10,puVar5);
          std::__cxx11::string::operator=(local_40,(string *)local_60);
          if (local_60[0] != local_50) {
            operator_delete(local_60[0]);
          }
          this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar5 - (int)puVar10 & 1));
          tex = local_38;
        }
        else if (uVar11 == 0x57524150) {
          uVar11 = *puVar10;
          this->mFileBuffer = (uint8_t *)(puVar7 + 2);
          tex->wrapModeWidth = (uint)(ushort)((ushort)uVar11 << 8 | (ushort)uVar11 >> 8);
          uVar3 = *(ushort *)this->mFileBuffer;
          this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 2);
          tex->wrapModeHeight = (uint)(ushort)(uVar3 << 8 | uVar3 >> 8);
        }
      }
      else if (uVar11 == 0x57525048) {
        uVar11 = *puVar10;
        this->mFileBuffer = (uint8_t *)((long)puVar7 + 10);
        tex->wrapAmountH =
             (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                    uVar11 << 0x18);
      }
      else if (uVar11 == 0x57525057) {
        uVar11 = *puVar10;
        this->mFileBuffer = (uint8_t *)((long)puVar7 + 10);
        tex->wrapAmountW =
             (float)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                    uVar11 << 0x18);
      }
      this->mFileBuffer = (uint8_t *)puVar1;
      puVar10 = (uint *)((long)puVar1 + 6);
      puVar7 = puVar1;
    } while (puVar10 < (uint *)((ulong)size + (long)puVar4));
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2ImageMap(unsigned int size, LWO::Texture& tex )
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;
    while (true)
    {
        if (mFileBuffer + 6 >= end)break;
        LE_NCONST IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid SURF.BLOCK chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        case AI_LWO_PROJ:
            tex.mapMode = (Texture::MappingMode)GetU2();
            break;
        case AI_LWO_WRAP:
            tex.wrapModeWidth  = (Texture::Wrap)GetU2();
            tex.wrapModeHeight = (Texture::Wrap)GetU2();
            break;
        case AI_LWO_AXIS:
            tex.majorAxis = (Texture::Axes)GetU2();
            break;
        case AI_LWO_IMAG:
            tex.mClipIdx = GetU2();
            break;
        case AI_LWO_VMAP:
            GetS0(tex.mUVChannelIndex,head.length);
            break;
        case AI_LWO_WRPH:
            tex.wrapAmountH = GetF4();
            break;
        case AI_LWO_WRPW:
            tex.wrapAmountW = GetF4();
            break;
        }
        mFileBuffer = next;
    }
}